

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TalksLoader.cpp
# Opt level: O3

Expected<Talks> * __thiscall
cppti::TalksLoader::loadFrom
          (Expected<Talks> *__return_storage_ptr__,TalksLoader *this,string_view file)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ifstream ifs;
  long *local_268;
  undefined8 *local_260;
  long local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined4 local_240;
  undefined8 *local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  long local_218 [4];
  byte abStack_1f8 [488];
  
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,file._M_len,this + file._M_len,file._M_str);
  std::ifstream::ifstream(local_218,(string *)&local_268,_S_in);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if ((abStack_1f8[*(long *)(local_218[0] + -0x18)] & 5) == 0) {
    loadFrom(__return_storage_ptr__,(istream *)local_218);
  }
  else {
    local_240 = 0;
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"Failed to open database.","");
    local_268 = (long *)CONCAT44(local_268._4_4_,local_240);
    if (local_238 == &local_228) {
      uStack_248 = uStack_220;
      puVar2 = &local_250;
    }
    else {
      local_260 = local_238;
      puVar2 = local_238;
    }
    *(undefined4 *)
     &(__return_storage_ptr__->
      super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
      ).
      super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
      .
      super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
      .
      super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
      .
      super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
      .
      super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
      .field_0 = local_240;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
                     ).
                     super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
                     .
                     super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
                     .
                     super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
                     .
                     super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
                     .
                     super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
                     .field_0 + 0x18);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->
             super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
             ).
             super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
             .
             super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
             .
             super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
             .
             super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
             .
             super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
             .field_0 + 8) = puVar1;
    if (puVar2 == &local_250) {
      *puVar1 = local_228;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
               ).
               super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
               .
               super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
               .
               super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
               .
               super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
               .
               super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
               .field_0 + 0x20) = uStack_248;
    }
    else {
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->
               super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
               ).
               super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
               .
               super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
               .
               super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
               .
               super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
               .
               super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
               .field_0 + 8) = puVar2;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
               ).
               super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
               .
               super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
               .
               super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
               .
               super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
               .
               super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
               .field_0 + 0x18) = local_228;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
             ).
             super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
             .
             super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
             .
             super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
             .
             super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
             .
             super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
             .field_0 + 0x10) = local_230;
    (__return_storage_ptr__->
    super_expected_move_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
    ).
    super_expected_copy_assign_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
    .
    super_expected_move_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
    .
    super_expected_copy_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false>
    .
    super_expected_operations_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>
    .
    super_expected_storage_base<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext,_false,_false>
    .m_has_val = false;
  }
  std::ifstream::~ifstream(local_218);
  return __return_storage_ptr__;
}

Assistant:

Expected<Talks> TalksLoader::loadFrom(std::string_view file)
{
  auto ifs = std::ifstream{std::string{file}};
  if (!ifs)
    return tl::unexpected{
        ErrContext{ErrCode::DB_FAILED_TO_OPEN, "Failed to open database."}};
  return loadFrom(ifs);
}